

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

uint16_t __thiscall TcpServerImpl::GetServerPort(TcpServerImpl *this)

{
  int iVar1;
  long *plVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  undefined8 uVar6;
  long lVar7;
  long unaff_R14;
  string caAddrPeer;
  string servInfoPeer;
  socklen_t addLen;
  sockaddr_storage addrPe;
  long *local_128 [2];
  long local_118 [2];
  long *local_108 [2];
  long local_f8 [2];
  long *local_e8 [2];
  long local_d8 [2];
  socklen_t local_c4;
  long *local_c0;
  sockaddr local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8.sa_family = 0;
  local_b8.sa_data[0] = '\0';
  local_b8.sa_data[1] = '\0';
  local_b8.sa_data[2] = '\0';
  local_b8.sa_data[3] = '\0';
  local_b8.sa_data[4] = '\0';
  local_b8.sa_data[5] = '\0';
  local_b8.sa_data[6] = '\0';
  local_b8.sa_data[7] = '\0';
  local_b8.sa_data[8] = '\0';
  local_b8.sa_data[9] = '\0';
  local_b8.sa_data[10] = '\0';
  local_b8.sa_data[0xb] = '\0';
  local_b8.sa_data[0xc] = '\0';
  local_b8.sa_data[0xd] = '\0';
  local_c4 = 0x80;
  iVar3 = getsockname(*(this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,&local_b8,&local_c4);
  if (iVar3 == 0) {
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct((ulong)local_108,'/');
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct((ulong)local_e8,' ');
    iVar3 = getnameinfo(&local_b8,0x80,(char *)local_108[0],0x2e,(char *)local_e8[0],0x20,3);
    plVar2 = local_e8[0];
    if (iVar3 == 0) {
      local_128[0] = local_118;
      if (local_e8[0] == (long *)0x0) {
        lVar7 = 1;
      }
      else {
        sVar4 = strlen((char *)local_e8[0]);
        lVar7 = (long)plVar2 + sVar4;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,plVar2,lVar7);
      plVar2 = local_128[0];
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      *piVar5 = 0;
      unaff_R14 = strtol((char *)plVar2,(char **)&local_c0,10);
      if (local_c0 == plVar2) {
        std::__throw_invalid_argument("stoi");
LAB_0011b153:
        uVar6 = std::__throw_out_of_range("stoi");
        if (local_e8[0] != local_d8) {
          operator_delete(local_e8[0],local_d8[0] + 1);
        }
        if (local_108[0] != local_f8) {
          operator_delete(local_108[0],local_f8[0] + 1);
        }
        _Unwind_Resume(uVar6);
      }
      if (((int)unaff_R14 != unaff_R14) || (*piVar5 == 0x22)) goto LAB_0011b153;
      if (*piVar5 == 0) {
        *piVar5 = iVar1;
      }
      if (local_128[0] != local_118) {
        operator_delete(local_128[0],local_118[0] + 1);
      }
    }
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],local_d8[0] + 1);
    }
    if (local_108[0] != local_f8) {
      operator_delete(local_108[0],local_f8[0] + 1);
    }
    if (iVar3 == 0) {
      return (uint16_t)unaff_R14;
    }
  }
  return 0;
}

Assistant:

uint16_t TcpServerImpl::GetServerPort()
{
    struct sockaddr_storage addrPe{};
    socklen_t addLen = sizeof(addrPe);
    if (::getsockname(m_vSock[0], reinterpret_cast<struct sockaddr*>(&addrPe), &addLen) == 0)  // Get our IP where the connection was established
    {
        string caAddrPeer(INET6_ADDRSTRLEN + 1, 0);
        string servInfoPeer(NI_MAXSERV, 0);
        if (::getnameinfo(reinterpret_cast<struct sockaddr*>(&addrPe), sizeof(struct sockaddr_storage), &caAddrPeer[0], INET6_ADDRSTRLEN, &servInfoPeer[0], NI_MAXSERV, NI_NUMERICHOST | NI_NUMERICSERV) == 0)
        {
            return static_cast<uint16_t>(stoi(&servInfoPeer[0]));
        }
    }

    return 0;
}